

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int pcut_count_tests(pcut_item_t *it)

{
  int iVar1;
  
  iVar1 = 0;
  if (it == (pcut_item_t *)0x0) {
    return 0;
  }
  do {
    iVar1 = (uint)(it->kind == 5) + iVar1;
    do {
      it = it->next;
      if (it == (pcut_item_t *)0x0) {
        return iVar1;
      }
    } while (it->kind == 0);
  } while( true );
}

Assistant:

int pcut_count_tests(pcut_item_t *it) {
	int count = 0;
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TEST) {
			count++;
		}
		it = pcut_get_real_next(it);
	}
	return count;
}